

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_threadpool_queue_work_simple(void)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv_loop_t loop;
  uv_work_t uStack_3e0;
  uv_loop_t *puStack_360;
  uv_loop_t uStack_358;
  
  puVar4 = &uStack_358;
  puStack_360 = (uv_loop_t *)0x14d34c;
  puVar3 = uv_default_loop();
  puStack_360 = (uv_loop_t *)0x14d354;
  assert_run_work(puVar3);
  puStack_360 = (uv_loop_t *)0x14d359;
  uVar1 = fork();
  if (uVar1 == 0) {
    puStack_360 = (uv_loop_t *)0x14d383;
    getpid();
    puStack_360 = (uv_loop_t *)0x14d393;
    printf("Running child in %d\n");
    puStack_360 = (uv_loop_t *)0x14d39e;
    uv_loop_init(&uStack_358);
    puStack_360 = (uv_loop_t *)0x14d3aa;
    puts("Child first watch");
    puStack_360 = (uv_loop_t *)0x14d3b2;
    assert_run_work(&uStack_358);
    puStack_360 = (uv_loop_t *)0x14d3ba;
    uv_loop_close(&uStack_358);
    puStack_360 = (uv_loop_t *)0x14d3c6;
    puts("Child second watch default loop");
    puStack_360 = (uv_loop_t *)0x14d3cb;
    puVar3 = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x14d3d3;
    iVar2 = uv_loop_fork(puVar3);
    if (iVar2 == 0) {
      puStack_360 = (uv_loop_t *)0x14d3dc;
      puVar3 = uv_default_loop();
      puStack_360 = (uv_loop_t *)0x14d3e4;
      assert_run_work(puVar3);
      puStack_360 = (uv_loop_t *)0x14d3f0;
      puts("Exiting child ");
      goto LAB_0014d3f0;
    }
  }
  else {
    puVar4 = (uv_loop_t *)(ulong)uVar1;
    if (uVar1 != 0xffffffff) {
      puStack_360 = (uv_loop_t *)0x14d36d;
      puVar3 = uv_default_loop();
      puStack_360 = (uv_loop_t *)0x14d375;
      assert_run_work(puVar3);
      puStack_360 = (uv_loop_t *)0x14d37c;
      assert_wait_child(uVar1);
LAB_0014d3f0:
      puStack_360 = (uv_loop_t *)0x14d3f5;
      puVar4 = uv_default_loop();
      puStack_360 = (uv_loop_t *)0x14d409;
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      puStack_360 = (uv_loop_t *)0x14d413;
      uv_run(puVar4,UV_RUN_DEFAULT);
      puStack_360 = (uv_loop_t *)0x14d418;
      puVar3 = uv_default_loop();
      puStack_360 = (uv_loop_t *)0x14d420;
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        return 0;
      }
      puStack_360 = (uv_loop_t *)0x14d434;
      run_test_fork_threadpool_queue_work_simple_cold_3();
    }
    puStack_360 = (uv_loop_t *)0x14d439;
    run_test_fork_threadpool_queue_work_simple_cold_2();
  }
  puStack_360 = (uv_loop_t *)assert_run_work;
  run_test_fork_threadpool_queue_work_simple_cold_1();
  puStack_360 = puVar4;
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014d4e2;
    uVar1 = getpid();
    printf("Queue in %d\n",(ulong)uVar1);
    puVar4 = puVar3;
    iVar2 = uv_queue_work(puVar3,&uStack_3e0,work_cb,after_work_cb);
    if (iVar2 != 0) goto LAB_0014d4e7;
    getpid();
    printf("Running in %d\n");
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return 0;
      }
      goto LAB_0014d4f1;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014d4e2:
    assert_run_work_cold_2();
    puVar4 = puVar3;
LAB_0014d4e7:
    puVar3 = puVar4;
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014d4f1:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fork_threadpool_queue_work_simple) {
  /* The threadpool works in a child process. */

  pid_t child_pid;
  uv_loop_t loop;

  /* Prime the pool and default loop. */
  assert_run_work(uv_default_loop());

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* Parent. We can still run work. */
    assert_run_work(uv_default_loop());
    assert_wait_child(child_pid);
  } else {
    /* Child. We can work in a new loop. */
    printf("Running child in %d\n", getpid());
    uv_loop_init(&loop);
    printf("Child first watch\n");
    assert_run_work(&loop);
    uv_loop_close(&loop);
    printf("Child second watch default loop\n");
    /* We can work in the default loop. */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    assert_run_work(uv_default_loop());
    printf("Exiting child \n");
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
}